

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdp.cpp
# Opt level: O0

BeliefUpperBound * __thiscall
despot::BeliefMDP::CreateBeliefUpperBound(BeliefMDP *this,string *name)

{
  bool bVar1;
  TrivialBeliefUpperBound *this_00;
  ostream *poVar2;
  string *name_local;
  BeliefMDP *this_local;
  
  bVar1 = std::operator==(name,"TRIVIAL");
  if (!bVar1) {
    bVar1 = std::operator==(name,"DEFAULT");
    if (!bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Unsupported belief upper bound: ");
      poVar2 = std::operator<<(poVar2,(string *)name);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      exit(1);
    }
  }
  this_00 = (TrivialBeliefUpperBound *)operator_new(0x10);
  TrivialBeliefUpperBound::TrivialBeliefUpperBound(this_00,&this->super_DSPOMDP);
  return &this_00->super_BeliefUpperBound;
}

Assistant:

BeliefUpperBound* BeliefMDP::CreateBeliefUpperBound(string name) const {
	if (name == "TRIVIAL" || name == "DEFAULT") {
		return new TrivialBeliefUpperBound(this);
	} else {
		cerr << "Unsupported belief upper bound: " << name << endl;
		exit(1);
		return NULL;
	}
}